

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O2

void GetOpt::_Option::setTokenAsUsed(Token *token,ShortOptions *short_ops,Type usedAs)

{
  if (token->type == PossibleNegativeArgument) {
    std::
    _Rb_tree<char,_std::pair<const_char,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_char,_GetOpt::OptionData>_>,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
    ::erase(&short_ops->_M_t,(token->value)._M_dataplus._M_p + 1);
  }
  token->type = usedAs;
  return;
}

Assistant:

static void setTokenAsUsed(Token* token, ShortOptions& short_ops, Token::Type usedAs)
    {
        if (token->type == Token::PossibleNegativeArgument)
            short_ops.erase(token->value[1]);

        token->type = usedAs;
    }